

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O3

int grad_calc2(custom_function *funcpt,double *x,int N,double *dx,double eps3,double *f)

{
  ulong uVar1;
  char *__format;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (0 < N) {
    uVar1 = 0;
    do {
      dVar3 = x[uVar1];
      dVar5 = dVar3;
      if (ABS(dVar3) < 1.0 / ABS(dx[uVar1])) {
        dVar3 = signx(dVar3);
        dVar3 = dVar3 / ABS(dx[uVar1]);
        dVar5 = x[uVar1];
      }
      dVar4 = dVar3 * eps3 + dVar5;
      x[uVar1] = dVar4;
      dVar3 = (*funcpt->funcpt)(x,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar3)) {
LAB_00141d7e:
        __format = "Program Exiting as the function value exceeds the maximum double value";
LAB_00141d8e:
        printf(__format);
        return 0xf;
      }
      if (NAN(dVar3)) {
LAB_00141d87:
        __format = "Program Exiting as the function returns NaN";
        goto LAB_00141d8e;
      }
      dVar4 = dVar4 - dVar5;
      x[uVar1] = dVar5 - dVar4;
      dVar2 = (*funcpt->funcpt)(x,N,funcpt->params);
      if (1.79769313486232e+308 <= ABS(dVar2)) goto LAB_00141d7e;
      if (NAN(dVar2)) goto LAB_00141d87;
      f[uVar1] = (dVar3 - dVar2) / (dVar4 + dVar4);
      x[uVar1] = dVar5;
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return 0;
}

Assistant:

int grad_calc2(custom_function *funcpt, double *x, int N, double *dx, double eps3, double *f) {
	int j,retval;
	double stepsize,stepmax,temp;
	double fp,fm;

	retval = 0;

	for (j = 0; j < N;++j) {
		if (fabs(x[j]) >= 1.0 / fabs(dx[j])) {
			stepmax = x[j];
		}
		else {
			stepmax = signx(x[j]) * 1.0 / fabs(dx[j]);
		}

		stepsize = stepmax * eps3;
		temp = x[j];
		x[j] += stepsize;
		stepsize = x[j] - temp;
		fp = FUNCPT_EVAL(funcpt,x,N);
		if (fp >= DBL_MAX || fp <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			return 15;
		}
		if (fp != fp) {
			printf("Program Exiting as the function returns NaN");
			return 15;
		}
		x[j] = temp - stepsize;
		fm = FUNCPT_EVAL(funcpt,x,N);
		if (fm >= DBL_MAX || fm <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			return 15;
		}
		if (fm != fm) {
			printf("Program Exiting as the function returns NaN");
			return 15;
		}
		f[j] = (fp - fm)/ (2 * stepsize);
		x[j] = temp;
	}

	return retval;
}